

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O1

shared_ptr<ot::commissioner::coap::Message> __thiscall
ot::commissioner::coap::Message::Deserialize(Message *this,Error *aError,ByteArray *aBuf)

{
  uint8_t *this_00;
  ulong uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  pointer puVar2;
  long lVar3;
  OptionType aType;
  type tVar4;
  bool bVar5;
  ushort uVar6;
  ulong uVar7;
  char *pcVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var10;
  char *pcVar11;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  shared_ptr<ot::commissioner::coap::Message> sVar12;
  format_args args;
  format_args args_00;
  format_args args_01;
  string_view fmt;
  OptionType number;
  size_t offset;
  Error error;
  OptionValue value;
  OptionType local_11a;
  undefined1 local_118 [8];
  code *local_110;
  size_t local_108;
  ulong local_100;
  format_string_checker<char> *local_f8;
  parse_func local_f0 [1];
  uint local_e4;
  size_t local_e0;
  type local_d8;
  undefined1 *local_d0;
  undefined8 local_c8;
  undefined1 local_c0 [16];
  Message *local_b0;
  string local_a8;
  undefined1 local_88 [8];
  char *local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  uint8_t *local_60;
  Error *local_58;
  ByteArray *local_50;
  OptionValue local_48;
  
  local_d0 = local_c0;
  local_d8 = 0;
  local_c8 = 0;
  local_c0[0] = 0;
  local_e0 = 0;
  *(undefined8 *)&this->mHeader = 0;
  this_00 = (this->mHeader).mToken + 4;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<ot::commissioner::coap::Message,std::allocator<ot::commissioner::coap::Message>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_00,(Message **)this,
             (allocator<ot::commissioner::coap::Message> *)local_118);
  local_60 = this_00;
  local_58 = aError;
  Deserialize((Error *)local_118,*(Header **)&this->mHeader,aBuf,&local_e0);
  local_d8 = local_118._0_4_;
  std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_110);
  tVar4 = local_d8;
  if (local_110 != (code *)&local_100) {
    operator_delete(local_110);
  }
  if (tVar4 == none_type) {
    if (**(byte **)&this->mHeader < 0x90 && (**(byte **)&this->mHeader & 3) == 1) {
      local_e4 = 0;
      local_b0 = this;
      local_50 = aBuf;
      while( true ) {
        puVar2 = (local_50->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        uVar7 = (long)(local_50->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)puVar2;
        if (uVar7 <= local_e0) break;
        if (puVar2[local_e0] == 0xff) {
          if (local_e0 < uVar7) {
            uVar1 = local_e0 + 1;
            if (puVar2[local_e0] == 0xff) {
              if (uVar7 <= uVar1) {
                local_e0 = uVar1;
                ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
                args_01.field_1.args_ = in_R9.args_;
                args_01.desc_ = (unsigned_long_long)&local_a8;
                ::fmt::v10::vformat_abi_cxx11_
                          ((string *)local_88,(v10 *)"payload marker followed by empty payload",
                           (string_view)ZEXT816(0x28),args_01);
                local_118._0_4_ = 8;
                local_110 = (code *)&local_100;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_110,CONCAT44(local_88._4_4_,local_88._0_4_),
                           local_80 + CONCAT44(local_88._4_4_,local_88._0_4_));
                local_d8 = local_118._0_4_;
                std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_110);
                if (local_110 != (code *)&local_100) {
                  operator_delete(local_110);
                }
                paVar9 = &local_78;
                goto LAB_0014f8f1;
              }
              local_e0 = uVar1;
              std::vector<unsigned_char,std::allocator<unsigned_char>>::
              _M_assign_aux<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                        ((vector<unsigned_char,std::allocator<unsigned_char>> *)
                         (*(long *)&this->mHeader + 0x40),puVar2 + uVar1);
            }
            else {
              lVar3 = *(long *)&this->mHeader;
              local_e0 = uVar1;
              if (*(long *)(lVar3 + 0x48) != *(long *)(lVar3 + 0x40)) {
                *(long *)(lVar3 + 0x48) = *(long *)(lVar3 + 0x40);
              }
            }
          }
          break;
        }
        local_48.mValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_48.mValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_48.mValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        in_R9.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)&local_e0;
        Deserialize((Error *)local_118,&local_11a,&local_48,(uint16_t)local_e4,local_50,
                    (size_t *)in_R9.values_);
        local_d8 = local_118._0_4_;
        std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_110);
        tVar4 = local_d8;
        if (local_110 != (code *)&local_100) {
          operator_delete(local_110);
        }
        aType = local_11a;
        if (tVar4 == none_type) {
          bVar5 = IsValidOption(local_11a,&local_48);
          if (bVar5) {
            AppendOption((Error *)local_118,*(Message **)&local_b0->mHeader,aType,&local_48);
            local_d8 = local_118._0_4_;
            std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_110);
            this = local_b0;
            if (local_110 != (code *)&local_100) {
              operator_delete(local_110);
              this = local_b0;
            }
          }
          else {
            local_118._0_4_ = custom_type;
            local_110 = (code *)0x216fac;
            local_108 = 0x1a;
            local_100 = 0x100000000;
            local_f0[0] = ::fmt::v10::detail::
                          parse_format_specs<ot::commissioner::coap::OptionType,fmt::v10::detail::compile_parse_context<char>>
            ;
            pcVar11 = "bad CoAP option (number={}";
            local_f8 = (format_string_checker<char> *)local_118;
            do {
              pcVar8 = pcVar11 + 1;
              if (*pcVar11 == '}') {
                if ((pcVar8 == "") || (*pcVar8 != '}')) {
                  ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
                }
                pcVar8 = pcVar11 + 2;
              }
              else if (*pcVar11 == '{') {
                pcVar8 = ::fmt::v10::detail::
                         parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,ot::commissioner::coap::OptionType>&>
                                   (pcVar11,"",(format_string_checker<char> *)local_118);
              }
              pcVar11 = pcVar8;
            } while (pcVar8 != "");
            local_118 = (undefined1  [8])&local_11a;
            local_110 = ::fmt::v10::detail::
                        value<fmt::v10::basic_format_context<fmt::v10::appender,char>>::
                        format_custom_arg<ot::commissioner::coap::OptionType,fmt::v10::formatter<ot::commissioner::coap::OptionType,char,void>>
            ;
            args.field_1.args_ = in_R9.args_;
            args.desc_ = (unsigned_long_long)local_118;
            fmt.size_ = 0xf;
            fmt.data_ = (char *)0x1a;
            ::fmt::v10::vformat_abi_cxx11_(&local_a8,(v10 *)"bad CoAP option (number={}",fmt,args);
            local_88._0_4_ = char_type;
            local_80 = local_78._M_local_buf + 8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_80,local_a8._M_dataplus._M_p,
                       local_a8._M_dataplus._M_p + local_a8._M_string_length);
            local_d8 = local_88._0_4_;
            std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_80);
            if (local_80 != local_78._M_local_buf + 8) {
              operator_delete(local_80);
            }
            this = local_b0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
              operator_delete(local_a8._M_dataplus._M_p);
            }
          }
          if (local_d8 != none_type) {
            uVar6 = (ushort)(local_11a - kIfMatch) >> 1 |
                    (ushort)((local_11a - kIfMatch & 1) != 0) << 0xf;
            if ((uVar6 < 0x14) && ((0xa01afU >> (uVar6 & 0x1f) & 1) != 0)) goto LAB_0014f779;
            local_118 = (undefined1  [8])((ulong)local_118 & 0xffffffff00000000);
            local_108 = 0;
            local_100 = local_100 & 0xffffffffffffff00;
            local_d8 = none_type;
            local_110 = (code *)&local_100;
            std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_110);
            if (local_110 != (code *)&local_100) {
              operator_delete(local_110);
            }
          }
          bVar5 = true;
          local_e4 = (uint)local_11a;
        }
        else {
LAB_0014f779:
          bVar5 = false;
        }
        if (local_48.mValue.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_48.mValue.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (!bVar5) break;
      }
    }
    else {
      local_118 = (undefined1  [8])((ulong)local_118 & 0xffffffff00000000);
      local_110 = (code *)0x216c77;
      local_108 = 0x1b;
      local_100 = 0;
      local_f0[0] = (parse_func)0x0;
      pcVar11 = "invalid CoAP message header";
      local_f8 = (format_string_checker<char> *)local_118;
      do {
        pcVar8 = pcVar11 + 1;
        if (*pcVar11 == '}') {
          if ((pcVar8 == "") || (*pcVar8 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar8 = pcVar11 + 2;
        }
        else if (*pcVar11 == '{') {
          pcVar8 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                             (pcVar11,"",(format_string_checker<char> *)local_118);
        }
        pcVar11 = pcVar8;
      } while (pcVar8 != "");
      args_00.field_1.values_ = in_R9.values_;
      args_00.desc_ = (unsigned_long_long)local_118;
      ::fmt::v10::vformat_abi_cxx11_(&local_a8,(v10 *)0x216c77,(string_view)ZEXT816(0x1b),args_00);
      local_88._0_4_ = char_type;
      local_80 = local_78._M_local_buf + 8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_80,local_a8._M_dataplus._M_p,
                 local_a8._M_dataplus._M_p + local_a8._M_string_length);
      local_d8 = local_88._0_4_;
      std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_80);
      if (local_80 != local_78._M_local_buf + 8) {
        operator_delete(local_80);
      }
      paVar9 = &local_a8.field_2;
LAB_0014f8f1:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*(undefined1 **)(paVar9->_M_local_buf + -0x10) != paVar9) {
        operator_delete(*(undefined1 **)(paVar9->_M_local_buf + -0x10));
      }
    }
  }
  if (local_d8 != none_type) {
    this_01 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((this->mHeader).mToken + 4);
    *(undefined8 *)&this->mHeader = 0;
    *(undefined8 *)((this->mHeader).mToken + 4) = 0;
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    }
  }
  local_58->mCode = local_d8;
  std::__cxx11::string::_M_assign((string *)&local_58->mMessage);
  _Var10._M_pi = extraout_RDX;
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
    _Var10._M_pi = extraout_RDX_00;
  }
  sVar12.super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = _Var10._M_pi;
  sVar12.super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       this;
  return (shared_ptr<ot::commissioner::coap::Message>)
         sVar12.super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Message> Message::Deserialize(Error &aError, const ByteArray &aBuf)
{
    Error    error;
    size_t   offset = 0;
    uint16_t lastOptionNumber;
    auto     message = std::make_shared<Message>();

    SuccessOrExit(error = Deserialize(message->mHeader, aBuf, offset));
    VerifyOrExit(message->mHeader.IsValid(), error = ERROR_BAD_FORMAT("invalid CoAP message header"));

    lastOptionNumber = 0;
    while (offset < aBuf.size() && aBuf[offset] != kPayloadMarker)
    {
        OptionType  number;
        OptionValue value;

        SuccessOrExit(error = Deserialize(number, value, lastOptionNumber, aBuf, offset));

        if (IsValidOption(number, value))
        {
            // AppendOption will do further validation before adding the option.
            error = message->AppendOption(number, value);
        }
        else
        {
            error = ERROR_BAD_FORMAT("bad CoAP option (number={}", number);
        }

        if (error != ErrorCode::kNone)
        {
            if (IsCriticalOption(number))
            {
                // Stop if any unrecognized option is critical.
                ExitNow();
            }
            else
            {
                // Ignore non-critical option error.
                error = ERROR_NONE;
            }
        }

        lastOptionNumber = utils::to_underlying(number);
    }

    if (offset < aBuf.size())
    {
        if (aBuf[offset++] == kPayloadMarker)
        {
            VerifyOrExit(offset < aBuf.size(), error = ERROR_BAD_FORMAT("payload marker followed by empty payload"));
            message->mPayload.assign(aBuf.begin() + offset, aBuf.end());
        }
        else
        {
            // Ignore extra data.
            message->mPayload.clear();
        }
    }

exit:
    if (error != ErrorCode::kNone)
    {
        message = nullptr;
    }
    aError = error;
    return message;
}